

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O0

void __thiscall Sms_Apu::run_until(Sms_Apu *this,blip_time_t end_time)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  Sms_Noise *unaff_retaddr;
  blip_time_t in_stack_00000008;
  blip_time_t in_stack_0000000c;
  Sms_Osc *osc;
  int i;
  undefined4 local_10;
  long lVar2;
  
  if (*(int *)(in_RDI + 0x428) < in_ESI) {
    lVar2 = in_RDI;
    for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
      lVar1 = *(long *)(in_RDI + (long)local_10 * 8);
      if (*(long *)(lVar1 + 0x20) != 0) {
        Blip_Buffer::set_modified(*(Blip_Buffer **)(lVar1 + 0x20));
        if (local_10 < 3) {
          Sms_Square::run((Sms_Square *)osc,in_stack_0000000c,in_stack_00000008);
        }
        else {
          Sms_Noise::run(unaff_retaddr,(blip_time_t)((ulong)lVar2 >> 0x20),(blip_time_t)lVar2);
        }
      }
    }
    *(int *)(in_RDI + 0x428) = in_ESI;
  }
  return;
}

Assistant:

void Sms_Apu::run_until( blip_time_t end_time )
{
	require( end_time >= last_time ); // end_time must not be before previous time
	
	if ( end_time > last_time )
	{
		// run oscillators
		for ( int i = 0; i < osc_count; ++i )
		{
			Sms_Osc& osc = *oscs [i];
			if ( osc.output )
			{
				osc.output->set_modified();
				if ( i < 3 )
					squares [i].run( last_time, end_time );
				else
					noise.run( last_time, end_time );
			}
		}
		
		last_time = end_time;
	}
}